

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  ulong uVar1;
  sqlite3_xauth p_Var2;
  int iVar3;
  sqlite3 *db_00;
  Select *pSVar4;
  uchar *puVar5;
  sqlite3_context *in_RDI;
  int i2;
  int i1;
  NameContext sNC;
  Parse sParse;
  int rc;
  sqlite3_xauth xAuth;
  int isLegacy;
  int bTemp;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  Select *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  sqlite3 *in_stack_fffffffffffffdf0;
  sqlite3 *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  Parse *in_stack_fffffffffffffe10;
  int local_1c8;
  int local_1b0;
  char *in_stack_fffffffffffffed8;
  Parse *in_stack_fffffffffffffee0;
  long local_a8;
  long local_98;
  int local_44;
  
  db_00 = sqlite3_context_db_handle(in_RDI);
  pSVar4 = (Select *)sqlite3_value_text((sqlite3_value *)0x1deb43);
  puVar5 = sqlite3_value_text((sqlite3_value *)0x1deb5c);
  iVar3 = sqlite3_value_int((sqlite3_value *)0x1deb75);
  uVar1 = db_00->flags;
  p_Var2 = db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  if ((pSVar4 != (Select *)0x0) && (puVar5 != (uchar *)0x0)) {
    local_44 = renameParseSql(in_stack_fffffffffffffe10,
                              (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                              in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,
                              (char *)in_stack_fffffffffffffdf0,
                              (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
    if (local_44 == 0) {
      if ((((uVar1 & 0x4000000) == 0) && (local_a8 != 0)) && (*(long *)(local_a8 + 0x18) != 0)) {
        memset(&stack0xfffffffffffffde8,0,0x38);
        sqlite3SelectPrep((Parse *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          in_stack_fffffffffffffdd8,(NameContext *)0x1dec7b);
        if (local_1b0 != 0) {
          local_44 = local_1c8;
        }
      }
      else if (local_98 != 0) {
        if ((uVar1 & 0x4000000) == 0) {
          in_stack_fffffffffffffdd8 = pSVar4;
          if (iVar3 != 0) {
            in_stack_fffffffffffffdd8 = (Select *)0x0;
          }
          local_44 = renameResolveTrigger(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        }
        iVar3 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
        if (local_44 == 0) {
          in_stack_fffffffffffffde4 = sqlite3SchemaToIndex(db_00,*(Schema **)(local_98 + 0x30));
          in_stack_fffffffffffffde0 =
               sqlite3FindDbName(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          if (in_stack_fffffffffffffde4 == in_stack_fffffffffffffde0) {
            sqlite3_result_int((sqlite3_context *)
                               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),iVar3);
          }
        }
      }
    }
    if (local_44 != 0) {
      renameColumnParseError
                ((sqlite3_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                 (sqlite3_value *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (sqlite3_value *)in_stack_fffffffffffffdf8,(Parse *)in_stack_fffffffffffffdf0);
    }
    renameParseCleanup((Parse *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  }
  db_00->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && sParse.pNewTable->pSelect ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ) sqlite3_result_int(context, 1);
        }
      }
    }

    if( rc!=SQLITE_OK ){
      renameColumnParseError(context, 1, argv[2], argv[3], &sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}